

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::set_begin(iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            *this)

{
  value_t vVar1;
  pointer pbVar2;
  
  pbVar2 = this->m_object;
  if (pbVar2 == (pointer)0x0) {
    __assert_fail("m_object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shiinamiyuki[P]miyuki/include/miyuki.serialize/json/json.hpp"
                  ,0x2508,
                  "void nlohmann::detail::iter_impl<nlohmann::basic_json<>>::set_begin() [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  vVar1 = pbVar2->m_type;
  if (vVar1 == null) {
    (this->m_it).primitive_iterator.m_it = 1;
    return;
  }
  if (vVar1 == array) {
    (this->m_it).array_iterator._M_current =
         (((pbVar2->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    return;
  }
  if (vVar1 == object) {
    (this->m_it).object_iterator._M_node =
         (((pbVar2->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    return;
  }
  (this->m_it).primitive_iterator.m_it = 0;
  return;
}

Assistant:

void set_begin() noexcept
    {
        assert(m_object != nullptr);

        switch (m_object->m_type)
        {
            case value_t::object:
            {
                m_it.object_iterator = m_object->m_value.object->begin();
                break;
            }

            case value_t::array:
            {
                m_it.array_iterator = m_object->m_value.array->begin();
                break;
            }

            case value_t::null:
            {
                // set to end so begin()==end() is true: null is empty
                m_it.primitive_iterator.set_end();
                break;
            }

            default:
            {
                m_it.primitive_iterator.set_begin();
                break;
            }
        }
    }